

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O0

IOTHUB_MESSAGE_RESULT
IoTHubMessage_GetByteArray(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle,uchar **buffer,size_t *size)

{
  LOGGER_LOG p_Var1;
  char *pcVar2;
  uchar *puVar3;
  size_t sVar4;
  LOGGER_LOG l_1;
  IOTHUB_MESSAGE_HANDLE_DATA *handleData;
  LOGGER_LOG l;
  IOTHUB_MESSAGE_RESULT result;
  size_t *size_local;
  uchar **buffer_local;
  IOTHUB_MESSAGE_HANDLE iotHubMessageHandle_local;
  
  if (((iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) || (buffer == (uchar **)0x0)) ||
     (size == (size_t *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                ,"IoTHubMessage_GetByteArray",0x1d2,1,
                "invalid parameter (NULL) to IoTHubMessage_GetByteArray IOTHUB_MESSAGE_HANDLE iotHubMessageHandle=%p, const unsigned char** buffer=%p, size_t* size=%p"
                ,iotHubMessageHandle,buffer,size);
    }
    l._4_4_ = IOTHUB_MESSAGE_INVALID_ARG;
  }
  else if (iotHubMessageHandle->contentType == IOTHUBMESSAGE_BYTEARRAY) {
    puVar3 = BUFFER_u_char((iotHubMessageHandle->value).byteArray);
    *buffer = puVar3;
    sVar4 = BUFFER_length((iotHubMessageHandle->value).byteArray);
    *size = sVar4;
    l._4_4_ = IOTHUB_MESSAGE_OK;
  }
  else {
    l._4_4_ = IOTHUB_MESSAGE_INVALID_ARG;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      pcVar2 = IOTHUBMESSAGE_CONTENT_TYPEStrings(iotHubMessageHandle->contentType);
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                ,"IoTHubMessage_GetByteArray",0x1db,1,"invalid type of message %s",pcVar2);
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_MESSAGE_RESULT IoTHubMessage_GetByteArray(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle, const unsigned char** buffer, size_t* size)
{
    IOTHUB_MESSAGE_RESULT result;
    if (
        (iotHubMessageHandle == NULL) ||
        (buffer == NULL) ||
        (size == NULL)
        )
    {
        LogError("invalid parameter (NULL) to IoTHubMessage_GetByteArray IOTHUB_MESSAGE_HANDLE iotHubMessageHandle=%p, const unsigned char** buffer=%p, size_t* size=%p", iotHubMessageHandle, buffer, size);
        result = IOTHUB_MESSAGE_INVALID_ARG;
    }
    else
    {
        IOTHUB_MESSAGE_HANDLE_DATA* handleData = iotHubMessageHandle;
        if (handleData->contentType != IOTHUBMESSAGE_BYTEARRAY)
        {
            result = IOTHUB_MESSAGE_INVALID_ARG;
            LogError("invalid type of message %s", MU_ENUM_TO_STRING(IOTHUBMESSAGE_CONTENT_TYPE, handleData->contentType));
        }
        else
        {
            *buffer = BUFFER_u_char(handleData->value.byteArray);
            *size = BUFFER_length(handleData->value.byteArray);
            result = IOTHUB_MESSAGE_OK;
        }
    }
    return result;
}